

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O2

void __thiscall
ConfidentialTxOutReference_GetSerializeVsize_Test::TestBody
          (ConfidentialTxOutReference_GetSerializeVsize_Test *this)

{
  char *pcVar1;
  Amount AVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  AssertHelper local_238;
  AssertionResult gtest_ar;
  ConfidentialAssetId asset;
  ConfidentialTxOutReference txout_ref;
  ConfidentialTxOut txout;
  
  std::__cxx11::string::string
            ((string *)&txout,"1234567890123456789012345678901234567890123456789012345678901234",
             (allocator *)&txout_ref);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset,(string *)&txout);
  std::__cxx11::string::~string((string *)&txout);
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(1000000);
  gtest_ar._0_8_ = AVar2.amount_;
  gtest_ar.message_.ptr_._0_1_ = AVar2.ignore_check_;
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&txout_ref,(Amount *)&gtest_ar);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            (&txout,&exp_script,&asset,(ConfidentialValue *)&txout_ref);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&txout_ref);
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference(&txout_ref,&txout);
  local_240.ptr_._0_4_ =
       cfd::core::ConfidentialTxOutReference::GetSerializeVsize
                 (&txout_ref,false,0,0x34,(uint32_t *)0x0,0);
  local_238.data_._0_4_ = 0x43;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"txout_ref.GetSerializeVsize(false)","67",(uint *)&local_240,
             (int *)&local_238);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_240);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x15e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_240);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_240.ptr_._0_4_ = 0x376;
  local_238.data_._0_4_ =
       cfd::core::ConfidentialTxOutReference::GetSerializeVsize
                 (&txout_ref,true,0,0x24,(uint32_t *)0x0,0);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"886","txout_ref.GetSerializeVsize(true, 0, 36)",
             (int *)&local_240,(uint *)&local_238);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_240);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x160,pcVar1);
    testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_240);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_240.ptr_._0_4_ = 0x4b6;
  local_238.data_._0_4_ =
       cfd::core::ConfidentialTxOutReference::GetSerializeVsize
                 (&txout_ref,true,0,0x34,(uint32_t *)0x0,0);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"1206","txout_ref.GetSerializeVsize(true, 0, 52)",
             (int *)&local_240,(uint *)&local_238);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_240);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x162,pcVar1);
    testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_240);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_240.ptr_._0_4_ = 0x4a7;
  local_238.data_._0_4_ =
       cfd::core::ConfidentialTxOutReference::GetSerializeVsize
                 (&txout_ref,true,0,0x34,(uint32_t *)0x0,2);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"1191","txout_ref.GetSerializeVsize(true, 0, 52, nullptr, 2)",
             (int *)&local_240,(uint *)&local_238);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_240);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x164,pcVar1);
    testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_240);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&txout_ref);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&txout);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset);
  return;
}

Assistant:

TEST(ConfidentialTxOutReference, GetSerializeVsize) {
  int64_t satoshi = 1000000;
  ConfidentialAssetId asset("1234567890123456789012345678901234567890123456789012345678901234");
  ConfidentialTxOut txout(exp_script, asset,
      ConfidentialValue(Amount::CreateBySatoshiAmount(satoshi)));
  ConfidentialTxOutReference txout_ref(txout);

  EXPECT_EQ(txout_ref.GetSerializeVsize(false), 67);

  EXPECT_EQ(886, txout_ref.GetSerializeVsize(true, 0, 36));

  EXPECT_EQ(1206, txout_ref.GetSerializeVsize(true, 0, 52));

  EXPECT_EQ(1191, txout_ref.GetSerializeVsize(true, 0, 52, nullptr, 2));
}